

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O3

void __thiscall QAction::setShortcut(QAction *this,QKeySequence *shortcut)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QKeySequence> local_40;
  QKeySequence local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QKeySequence::isEmpty(shortcut);
  if (bVar1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      setShortcuts(this,UnknownKey);
      return;
    }
  }
  else {
    QKeySequence::QKeySequence(&local_28,shortcut);
    local_40.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_40.ptr = (QKeySequence *)QArrayData::allocate((QArrayData **)&local_40,8,0x10,1,KeepSize);
    QKeySequence::QKeySequence(local_40.ptr,&local_28);
    local_40.size = 1;
    setShortcuts(this,(QList<QKeySequence> *)&local_40);
    QArrayDataPointer<QKeySequence>::~QArrayDataPointer(&local_40);
    QKeySequence::~QKeySequence(&local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QAction::setShortcut(const QKeySequence &shortcut)
{
    if (shortcut.isEmpty())
        setShortcuts({});
    else
        setShortcuts({ shortcut });
}